

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11f98de::AV1LosslessFrameSizeTests_LosslessEncode_Test::TestBody
          (AV1LosslessFrameSizeTests_LosslessEncode_Test *this)

{
  bool bVar1;
  AssertHelper AStack_68;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  RandomVideoSource video;
  
  libaom_test::RandomVideoSource::RandomVideoSource(&video,0xbaba);
  libaom_test::DummyVideoSource::SetSize
            (&video.super_DummyVideoSource,
             *(uint *)&(this->super_AV1LosslessFrameSizeTests).super_EncoderTest.field_0x3dc,
             *(uint *)&(this->super_AV1LosslessFrameSizeTests).field_0x3f8);
  video.super_DummyVideoSource.limit_ = 10;
  (this->super_AV1LosslessFrameSizeTests).expected_res_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_AV1LosslessFrameSizeTests).super_EncoderTest._vptr_EncoderTest[2])
                (&(this->super_AV1LosslessFrameSizeTests).super_EncoderTest,&video);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (gtest_fatal_failure_checker.has_new_fatal_failure_ == false) goto LAB_005d5be4;
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_68,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
             ,0x17c,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&AStack_68);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_005d5be4:
  libaom_test::DummyVideoSource::~DummyVideoSource(&video.super_DummyVideoSource);
  return;
}

Assistant:

TEST_P(AV1LosslessFrameSizeTests, LosslessEncode) {
  ::libaom_test::RandomVideoSource video;

  video.SetSize(frame_size_param_.width, frame_size_param_.height);
  video.set_limit(10);
  expected_res_ = AOM_CODEC_OK;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}